

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O2

void __thiscall t_lua_generator::generate_service(t_lua_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *this_00;
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  undefined4 extraout_var_00;
  int __oflag;
  t_program *program;
  t_program *program_00;
  ofstream_with_content_based_conditional_update *poVar3;
  t_lua_generator *this_01;
  string cur_ns;
  string f_service_name;
  string outdir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_40,this);
  get_namespace_abi_cxx11_
            (&local_80,(t_lua_generator *)(this->super_t_oop_generator).super_t_generator.program_,
             program);
  std::operator+(&local_a0,&local_40,&local_80);
  iVar1 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  std::operator+(&local_c0,&local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar1));
  std::operator+(&local_60,&local_c0,".lua");
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::string((string *)&local_c0,local_60._M_dataplus._M_p,(allocator *)&local_a0)
  ;
  this_00 = &this->f_service_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (this_00,(char *)&local_c0,__oflag);
  std::__cxx11::string::~string((string *)&local_c0);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_c0,this);
  poVar2 = std::operator<<((ostream *)this_00,(string *)&local_c0);
  lua_includes_abi_cxx11_(&local_a0,this);
  std::operator<<(poVar2,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  if (this->gen_requires_ == true) {
    poVar2 = std::operator<<((ostream *)this_00,(string *)&::endl_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"require \'");
    poVar2 = std::operator<<(poVar2,(string *)&local_80);
    poVar2 = std::operator<<(poVar2,"ttypes\'");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    if (tservice->extends_ != (t_service *)0x0) {
      poVar2 = std::operator<<((ostream *)this_00,"require \'");
      get_namespace_abi_cxx11_
                (&local_c0,(t_lua_generator *)(tservice->extends_->super_t_type).program_,program_00
                );
      poVar2 = std::operator<<(poVar2,(string *)&local_c0);
      iVar1 = (*(tservice->extends_->super_t_type).super_t_doc._vptr_t_doc[3])();
      poVar2 = std::operator<<(poVar2,(string *)CONCAT44(extraout_var_00,iVar1));
      poVar2 = std::operator<<(poVar2,"\'");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_c0);
    }
  }
  std::operator<<((ostream *)this_00,(string *)&::endl_abi_cxx11_);
  this_01 = this;
  generate_service_client(this,(ostream *)this_00,tservice);
  generate_service_interface(this_01,(ostream *)this_00,tservice);
  generate_service_processor(this,(ostream *)this_00,tservice);
  poVar3 = this_00;
  generate_service_helpers(this,(ostream *)this_00,tservice);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (this_00,(int)poVar3);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void t_lua_generator::generate_service(t_service* tservice) {
  // Get output directory
  string outdir = get_out_dir();

  // Open the file for writing
  string cur_ns = get_namespace(program_);
  string f_service_name = outdir + cur_ns + tservice->get_name() + ".lua";
  f_service_.open(f_service_name.c_str());

  // Headers
  f_service_ << autogen_comment() << lua_includes();
  if (gen_requires_) {
    f_service_ << endl << "require '" << cur_ns << "ttypes'" << endl;

    if (tservice->get_extends() != nullptr) {
      f_service_ << "require '" << get_namespace(tservice->get_extends()->get_program())
                 << tservice->get_extends()->get_name() << "'" << endl;
    }
  }

  f_service_ << endl;

  generate_service_client(f_service_, tservice);
  generate_service_interface(f_service_, tservice);
  generate_service_processor(f_service_, tservice);
  generate_service_helpers(f_service_, tservice);

  // Close the file
  f_service_.close();
}